

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial_sum_max.hpp
# Opt level: O2

pair<std::ostream_iterator<int,_char,_std::char_traits<char>_>,_int> * __thiscall
burst::
partial_sum_max<std::istream_iterator<int,char,std::char_traits<char>,long>,std::ostream_iterator<int,char,std::char_traits<char>>,std::plus<void>,std::less<void>>
          (pair<std::ostream_iterator<int,_char,_std::char_traits<char>_>,_int>
           *__return_storage_ptr__,burst *this,long *first,
          ostream_iterator<int,_char,_std::char_traits<char>_> *last)

{
  char *pcVar1;
  int iVar2;
  undefined8 in_RAX;
  int iVar3;
  undefined8 uStack_38;
  
  if ((this[0xc] == *(burst *)((long)first + 0xc)) &&
     ((this[0xc] == (burst)0x0 || (*(long *)this == *first)))) {
    pcVar1 = last->_M_string;
    (__return_storage_ptr__->first)._M_stream = last->_M_stream;
    (__return_storage_ptr__->first)._M_string = pcVar1;
    __return_storage_ptr__->second = 0;
  }
  else {
    iVar2 = *(int *)(this + 8);
    iVar3 = iVar2;
    uStack_38 = in_RAX;
    while( true ) {
      uStack_38 = CONCAT44(iVar2,(undefined4)uStack_38);
      std::ostream_iterator<int,_char,_std::char_traits<char>_>::operator=
                (last,(int *)((long)&uStack_38 + 4));
      std::istream_iterator<int,_char,_std::char_traits<char>,_long>::_M_read
                ((istream_iterator<int,_char,_std::char_traits<char>,_long> *)this);
      if ((this[0xc] == *(burst *)((long)first + 0xc)) &&
         ((this[0xc] == (burst)0x0 || (*(long *)this == *first)))) break;
      iVar2 = *(int *)(this + 8);
      if (iVar3 <= iVar2) {
        iVar3 = iVar2;
      }
      iVar2 = iVar2 + uStack_38._4_4_;
    }
    pcVar1 = last->_M_string;
    (__return_storage_ptr__->first)._M_stream = last->_M_stream;
    (__return_storage_ptr__->first)._M_string = pcVar1;
    __return_storage_ptr__->second = iVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<OutputIterator, iterator_value_t<InputIterator>>
        partial_sum_max
        (
            InputIterator first,
            InputIterator last,
            OutputIterator result,
            BinaryFunction plus,
            BinaryPredicate less
        )
    {
        if (first != last)
        {
            auto sum = *first;
            auto max = sum;

            *result = sum;

            while (++first != last)
            {
                auto current = *first;
                if (less(max, current))
                {
                    max = current;
                }

                auto new_sum = plus(std::move(sum), std::move(current));
                sum = std::move(new_sum);

                ++result;
                *result = sum;
            }

            return {++result, max};
        }

        return {result, iterator_value_t<InputIterator>{}};
    }